

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers_test.cpp
# Opt level: O2

void __thiscall Array2D_Bounds_Test::Array2D_Bounds_Test(Array2D_Bounds_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0313b810;
  return;
}

Assistant:

TEST(Array2D, Bounds) {
    Bounds2i b(Point2i(-4, 3), Point2i(10, 7));
    Array2D<Point2f> a(b);

    EXPECT_EQ(b.pMax.x - b.pMin.x, a.xSize());
    EXPECT_EQ(b.pMax.y - b.pMin.y, a.ySize());

    for (Point2i p : b)
        a[p] = Point2f(p.y, p.x);

    for (Point2i p : b)
        EXPECT_EQ(Point2f(p.y, p.x), a[p]);
}